

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O1

int DisconnectMTx(MT *pMT)

{
  int iVar1;
  char *__s;
  long lVar2;
  
  lVar2 = 0;
  while ((MT *)addrsMT[lVar2] != pMT) {
    lVar2 = lVar2 + 1;
    if (lVar2 == 0x10) {
      return 1;
    }
  }
  iVar1 = CloseRS232Port(&pMT->RS232Port);
  __s = "MT disconnected.";
  if (iVar1 != 0) {
    __s = "MT disconnection failed.";
  }
  puts(__s);
  if (iVar1 != 0) {
    return (uint)(iVar1 != 0);
  }
  addrsMT[lVar2] = (void *)0x0;
  return 0;
}

Assistant:

HARDWAREX_API int DisconnectMTx(MT* pMT)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsMT[id] != pMT)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = DisconnectMT(pMT);
	if (res != EXIT_SUCCESS) return res;

	addrsMT[id] = NULL;

	return EXIT_SUCCESS;
}